

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall
mp::NLFeeder_Easy::
FeedLinearConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::SingleSparseVecWrtFactory<int,double>>
          (NLFeeder_Easy *this,int i,SingleSparseVecWrtFactory<int,_double> *svw)

{
  size_t *psVar1;
  size_t sVar2;
  int *piVar3;
  double *pdVar4;
  size_t *psVar5;
  size_t pos;
  size_t sVar6;
  SparseVectorWriter<int,_double> sv;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *local_40;
  char *local_38;
  
  psVar1 = (this->nlme_).A_.start_ + i;
  psVar5 = &(this->nlme_).A_.num_nz_;
  if (i < (this->nlme_).A_.num_colrow_ + -1) {
    psVar5 = psVar1 + 1;
  }
  sVar6 = *psVar1;
  sVar2 = *psVar5;
  if (sVar2 != sVar6) {
    piVar3 = (this->nlme_).A_.index_;
    pdVar4 = (this->nlme_).A_.value_;
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
    SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
              ((SingleSparseVecWrtFactory<int,_double> *)&local_40,(size_t)svw);
    do {
      local_38 = local_38 + -1;
      TextFormatter::apr(&local_40->super_FormatterType,&local_40->nm,"%d %g\n",pdVar4[sVar6],
                         (ulong)(uint)(this->var_perm_).
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[piVar3[sVar6]].first
                        );
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  return;
}

Assistant:

void FeedLinearConExpr(int i, ConLinearExprWriterFactory& svw) {
    auto A = NLME().GetA();
    assert(!A.num_nz_ || NLW2_MatrixFormatRowwise == A.format_);
    assert(NLME().NumRows() == A.num_colrow_);
    auto start = A.start_[i];
    auto end = (i < A.num_colrow_-1) ? A.start_[i+1] : A.num_nz_;
    if (start!=end) {
      auto sv = svw.MakeVectorWriter(end-start);
      for (auto pos=start; pos!=end; ++pos)
        sv.Write(VPerm(A.index_[pos]), A.value_[pos]);
    }
  }